

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::anon_unknown_0::IsinfCaseInstance::~IsinfCaseInstance(IsinfCaseInstance *this)

{
  IsinfCaseInstance *this_local;
  
  ~IsinfCaseInstance(this);
  operator_delete(this,0x220);
  return;
}

Assistant:

IsinfCaseInstance (Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, int numValues, const char* name)
		: CommonFunctionTestInstance(context, shaderType, spec, numValues, name)
	{
	}